

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O0

double ibeta(double x,double a,double b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int local_34;
  double dStack_30;
  int ctrlint;
  double temp;
  double oup;
  double b_local;
  double a_local;
  double x_local;
  
  oup = b;
  b_local = a;
  a_local = x;
  if ((x < 0.0) || (1.0 < x)) {
    printf("x only accepts real values between 0.0 and 1.0");
    exit(1);
  }
  if ((0.0 <= a) && (0.0 <= b)) {
    local_34 = 0;
    if (x < (a + 1.0) / (a + b + 2.0)) {
      dVar1 = gamma_log(a + b);
      dVar2 = gamma_log(b_local + 1.0);
      dVar3 = gamma_log(oup);
      dVar7 = b_local;
      dVar4 = log(a_local);
      dVar6 = oup;
      dVar5 = log1p(-a_local);
      dVar6 = exp(dVar6 * dVar5 + dVar7 * dVar4 + ((dVar1 - dVar2) - dVar3));
      dStack_30 = dVar6;
      dVar7 = bfrac(a_local,b_local,oup,&local_34);
      temp = dVar6 * dVar7;
    }
    if ((b_local + 1.0) / (b_local + oup + 2.0) <= a_local) {
      dVar1 = gamma_log(b_local + oup);
      dVar2 = gamma_log(oup + 1.0);
      dVar3 = gamma_log(b_local);
      dVar7 = b_local;
      dVar4 = log(a_local);
      dVar6 = oup;
      dVar5 = log1p(-a_local);
      dVar6 = exp(dVar6 * dVar5 + dVar7 * dVar4 + ((dVar1 - dVar2) - dVar3));
      dStack_30 = dVar6;
      dVar7 = bfrac(1.0 - a_local,oup,b_local,&local_34);
      temp = -dVar6 * dVar7 + 1.0;
    }
    if (local_34 == 1000) {
      temp = 0.0;
      temp = ibeta_appx(a_local,b_local,oup);
    }
    return temp;
  }
  printf(" The Two Inputs should be nonnegative and real");
  exit(1);
}

Assistant:

double ibeta(double x, double a , double b) {
	double oup,temp;
	int ctrlint;
	/*
	 * This program uses two methods described in Abramowitz and Stegun
	 * Handbook.
	 * Method 1. is based on 26.5.8 and uses Continued Fraction. The result
	 * is accepted if the convergence occurs in 1000 iterations.
	 * 
	 * If the program doesn't converge , then the results are discarded and 
	 * method 2. is used.
	 * 
	 * Method 2. uses approximation and is based on equations 26.5.20 (erf)
	 * and 26.5.21 (pgamma/qgamma) 
	 */ 
	if (x < 0. || x > 1.) {
		printf("x only accepts real values between 0.0 and 1.0");
		exit(1);
	}
	if (a < 0. || b < 0.) {
		printf(" The Two Inputs should be nonnegative and real");
		exit(1);
	}
	
	ctrlint = 0;
	
	// Method 1
	
	if ( x < (a+1.)/(a+b+2.)) {
		temp = exp(gamma_log(a+b) - gamma_log(a+1.) - gamma_log(b) + a*log(x) + b*log1p(-x));
		oup = temp * bfrac(x,a,b,&ctrlint); 
	}
	
	if ( x >= (a+1.)/(a+b+2.)) {
		temp = exp(gamma_log(a+b) - gamma_log(b+1.) - gamma_log(a) + a*log(x) + b*log1p(-x));
		oup = 1. - temp * bfrac(1. - x,b,a,&ctrlint); 
	}
	
	// Method 2 is invoked only if ctrlint = 1000
	if (ctrlint == 1000) {
		oup = 0.0;
		oup = ibeta_appx(x,a,b);
	}
	
	return oup;
	
}